

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O2

bool __thiscall chrono::ChBinaryArchive::IsBigEndianMachine(ChBinaryArchive *this)

{
  return false;
}

Assistant:

bool ChBinaryArchive::IsBigEndianMachine() {
    union {
        int word;
        unsigned char byte;
    } endian_test;

    endian_test.word = 1;
    if (endian_test.byte != 1)
        return true;

    return false;
}